

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
          (SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL> *this,Base *other)

{
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  Entry *unaff_retaddr;
  Entry *in_stack_00000008;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_stack_00000010;
  
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::SmallVectorBase(in_RDI,2);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::begin(in_RSI);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::end(in_RSI);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
  append<const_slang::IntervalMapDetails::Path::Entry_*>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

SmallVector(const Base& other) : Base(N) { this->append(other.begin(), other.end()); }